

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O0

Id dxil_spv::emit_coopmat_transpose(Impl *impl,Id v,uint32_t input_imm,uint32_t output_imm)

{
  uint uVar1;
  undefined8 uVar2;
  uint32_t uVar3;
  Id IVar4;
  Id IVar5;
  uint32_t uVar6;
  MemorySemanticsMask MVar7;
  Builder *this;
  LoggingCallback p_Var8;
  void *pvVar9;
  Operation *pOVar10;
  Operation *pOVar11;
  Operation *load;
  Id output_type;
  Operation *store;
  Operation *barrier;
  Operation *chain;
  Operation *index;
  Operation *subgroup_id;
  char local_2058 [4];
  Id subgroup_id_var;
  char buffer_1 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_1;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  uint32_t max_num_workgroups;
  uint32_t num_elements;
  Id lds_type_id;
  Builder *builder;
  uint32_t output_imm_local;
  uint32_t input_imm_local;
  Id v_local;
  Impl *impl_local;
  
  this = Converter::Impl::builder(impl);
  uVar3 = get_matrix_type(input_imm);
  if (((uVar3 != 0) && (uVar3 = get_matrix_type(output_imm), uVar3 != 0)) &&
     (uVar3 = get_type_data_format(input_imm), uVar3 == 10)) {
    IVar4 = emit_coopmat_transfer(impl,v,input_imm,output_imm);
    return IVar4;
  }
  if ((impl->ags).coopmat_transpose_scratch == 0) {
    IVar4 = spv::Builder::makeUintType(this,0x20);
    if ((impl->execution_mode_meta).wave_size_min == 0) {
      if ((impl->options).subgroup_size.implementation_minimum == 0) {
        buffer._4088_8_ = get_thread_log_callback();
        if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
          fprintf(_stderr,
                  "[ERROR]: Need LDS transpose, but there is no estimate for how large the LDS buffer needs to be.\n"
                 );
          fflush(_stderr);
        }
        else {
          snprintf((char *)&cb_1,0x1000,
                   "Need LDS transpose, but there is no estimate for how large the LDS buffer needs to be.\n"
                  );
          uVar2 = buffer._4088_8_;
          pvVar9 = get_thread_log_callback_userdata();
          (*(code *)uVar2)(pvVar9,2,&cb_1);
        }
        return 0;
      }
      uVar1 = (impl->options).subgroup_size.implementation_minimum;
    }
    else {
      uVar1 = (impl->execution_mode_meta).wave_size_min;
    }
    cb._4_4_ = ((impl->execution_mode_meta).workgroup_threads[0] *
                (impl->execution_mode_meta).workgroup_threads[1] *
               (impl->execution_mode_meta).workgroup_threads[2]) / uVar1;
    if (cb._4_4_ == 0) {
      p_Var8 = get_thread_log_callback();
      if (p_Var8 == (LoggingCallback)0x0) {
        fprintf(_stderr,"[ERROR]: Invalid workgroup size.\n");
        fflush(_stderr);
      }
      else {
        snprintf(local_2058,0x1000,"Invalid workgroup size.\n");
        pvVar9 = get_thread_log_callback_userdata();
        (*p_Var8)(pvVar9,Error,local_2058);
      }
      return 0;
    }
    IVar5 = spv::Builder::makeUintConstant(this,cb._4_4_ * 0x100,false);
    IVar4 = spv::Builder::makeArrayType(this,IVar4,IVar5,0);
    IVar4 = Converter::Impl::create_variable(impl,StorageClassWorkgroup,IVar4,"LDSTransposeScratch")
    ;
    (impl->ags).coopmat_transpose_scratch = IVar4;
  }
  uVar3 = get_type_data_format(input_imm);
  uVar6 = get_type_data_format(output_imm);
  if (uVar3 == uVar6) {
    uVar3 = get_type_data_format(input_imm);
    if (uVar3 == 6) {
      impl_local._4_4_ = 0;
    }
    else {
      IVar4 = SPIRVModule::get_builtin_shader_input(impl->spirv_module,BuiltInSubgroupId);
      IVar5 = spv::Builder::makeUintType(this,0x20);
      pOVar10 = Converter::Impl::allocate(impl,OpLoad,IVar5);
      Operation::add_id(pOVar10,IVar4);
      Converter::Impl::add(impl,pOVar10,false);
      IVar4 = spv::Builder::makeUintType(this,0x20);
      pOVar11 = Converter::Impl::allocate(impl,OpIMul,IVar4);
      Operation::add_id(pOVar11,pOVar10->id);
      IVar4 = spv::Builder::makeUintConstant(this,0x100,false);
      Operation::add_id(pOVar11,IVar4);
      Converter::Impl::add(impl,pOVar11,false);
      IVar4 = spv::Builder::makeUintType(this,0x20);
      IVar4 = spv::Builder::makePointer(this,StorageClassWorkgroup,IVar4);
      pOVar10 = Converter::Impl::allocate(impl,OpInBoundsAccessChain,IVar4);
      Operation::add_id(pOVar10,(impl->ags).coopmat_transpose_scratch);
      Operation::add_id(pOVar10,pOVar11->id);
      Converter::Impl::add(impl,pOVar10,false);
      pOVar11 = Converter::Impl::allocate(impl,OpControlBarrier);
      IVar4 = spv::Builder::makeUintConstant(this,3,false);
      Operation::add_id(pOVar11,IVar4);
      IVar4 = spv::Builder::makeUintConstant(this,2,false);
      Operation::add_id(pOVar11,IVar4);
      MVar7 = spv::operator|(MemorySemanticsWorkgroupMemoryMask,MemorySemanticsAcquireReleaseMask);
      IVar4 = spv::Builder::makeUintConstant(this,MVar7,false);
      Operation::add_id(pOVar11,IVar4);
      Converter::Impl::add(impl,pOVar11,false);
      pOVar11 = Converter::Impl::allocate(impl,OpCooperativeMatrixStoreKHR);
      Operation::add_id(pOVar11,pOVar10->id);
      Operation::add_id(pOVar11,v);
      IVar4 = spv::Builder::makeUintConstant(this,1,false);
      Operation::add_id(pOVar11,IVar4);
      IVar4 = spv::Builder::makeUintConstant(this,0x10,false);
      Operation::add_id(pOVar11,IVar4);
      Converter::Impl::add(impl,pOVar11,false);
      pOVar11 = Converter::Impl::allocate(impl,OpControlBarrier);
      IVar4 = spv::Builder::makeUintConstant(this,3,false);
      Operation::add_id(pOVar11,IVar4);
      IVar4 = spv::Builder::makeUintConstant(this,2,false);
      Operation::add_id(pOVar11,IVar4);
      MVar7 = spv::operator|(MemorySemanticsWorkgroupMemoryMask,MemorySemanticsAcquireReleaseMask);
      IVar4 = spv::Builder::makeUintConstant(this,MVar7,false);
      Operation::add_id(pOVar11,IVar4);
      Converter::Impl::add(impl,pOVar11,false);
      IVar4 = build_coopmat_type(impl,output_imm);
      if (IVar4 == 0) {
        impl_local._4_4_ = 0;
      }
      else {
        pOVar11 = Converter::Impl::allocate(impl,OpCooperativeMatrixLoadKHR,IVar4);
        Operation::add_id(pOVar11,pOVar10->id);
        IVar4 = spv::Builder::makeUintConstant(this,1,false);
        Operation::add_id(pOVar11,IVar4);
        IVar4 = spv::Builder::makeUintConstant(this,0x10,false);
        Operation::add_id(pOVar11,IVar4);
        Converter::Impl::add(impl,pOVar11,false);
        impl_local._4_4_ = pOVar11->id;
      }
    }
  }
  else {
    impl_local._4_4_ = 0;
  }
  return impl_local._4_4_;
}

Assistant:

static spv::Id emit_coopmat_transpose(Converter::Impl &impl, spv::Id v, uint32_t input_imm, uint32_t output_imm)
{
	auto &builder = impl.builder();

	if (get_matrix_type(input_imm) != AmdExtD3DShaderIntrinsicsWaveMatrixType_A &&
	    get_matrix_type(output_imm) != AmdExtD3DShaderIntrinsicsWaveMatrixType_A &&
	    get_type_data_format(input_imm) == AmdExtD3DShaderIntrinsicsWaveMatrixDataFormat_FP8)
	{
		// It appears that in the cases we care about, layout of B and C are the same.
		// Just do element-wise copy here to avoid the bad roundtrip.
		// This assumption only seems to hold for FP8, but that's the only case we care about.
		return emit_coopmat_transfer(impl, v, input_imm, output_imm);
	}

	if (!impl.ags.coopmat_transpose_scratch)
	{
		spv::Id lds_type_id = builder.makeUintType(32);
		uint32_t num_elements = 16 * 16;

		// Assume that the workgroup is aligned.
		uint32_t max_num_workgroups = impl.execution_mode_meta.workgroup_threads[0] *
		                              impl.execution_mode_meta.workgroup_threads[1] *
		                              impl.execution_mode_meta.workgroup_threads[2];

		if (impl.execution_mode_meta.wave_size_min)
			max_num_workgroups /= impl.execution_mode_meta.wave_size_min;
		else if (impl.options.subgroup_size.implementation_minimum)
			max_num_workgroups /= impl.options.subgroup_size.implementation_minimum;
		else
		{
			LOGE("Need LDS transpose, but there is no estimate for how large the LDS buffer needs to be.\n");
			return 0;
		}

		if (!max_num_workgroups)
		{
			LOGE("Invalid workgroup size.\n");
			return 0;
		}

		num_elements *= max_num_workgroups;

		lds_type_id = builder.makeArrayType(lds_type_id, builder.makeUintConstant(num_elements), 0);
		impl.ags.coopmat_transpose_scratch =
		    impl.create_variable(spv::StorageClassWorkgroup, lds_type_id, "LDSTransposeScratch");
	}

	if (get_type_data_format(input_imm) != get_type_data_format(output_imm))
		return 0;
	if (get_type_data_format(input_imm) == AmdExtD3DShaderIntrinsicsWaveMatrixDataFormat_F32)
		return 0;

	spv::Id subgroup_id_var = impl.spirv_module.get_builtin_shader_input(spv::BuiltInSubgroupId);
	auto *subgroup_id = impl.allocate(spv::OpLoad, builder.makeUintType(32));
	subgroup_id->add_id(subgroup_id_var);
	impl.add(subgroup_id);

	auto *index = impl.allocate(spv::OpIMul, builder.makeUintType(32));
	index->add_id(subgroup_id->id);
	index->add_id(builder.makeUintConstant(16 * 16));
	impl.add(index);

	auto *chain = impl.allocate(spv::OpInBoundsAccessChain,
	                            builder.makePointer(spv::StorageClassWorkgroup, builder.makeUintType(32)));
	chain->add_id(impl.ags.coopmat_transpose_scratch);
	chain->add_id(index->id);
	impl.add(chain);

	auto *barrier = impl.allocate(spv::OpControlBarrier);
	barrier->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
	barrier->add_id(builder.makeUintConstant(spv::ScopeWorkgroup));
	barrier->add_id(builder.makeUintConstant(spv::MemorySemanticsWorkgroupMemoryMask | spv::MemorySemanticsAcquireReleaseMask));
	impl.add(barrier);

	auto *store = impl.allocate(spv::OpCooperativeMatrixStoreKHR);
	store->add_id(chain->id);
	store->add_id(v);
	store->add_id(builder.makeUintConstant(spv::CooperativeMatrixLayoutColumnMajorKHR));
	store->add_id(builder.makeUintConstant(16));
	impl.add(store);

	barrier = impl.allocate(spv::OpControlBarrier);
	barrier->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
	barrier->add_id(builder.makeUintConstant(spv::ScopeWorkgroup));
	barrier->add_id(builder.makeUintConstant(spv::MemorySemanticsWorkgroupMemoryMask | spv::MemorySemanticsAcquireReleaseMask));
	impl.add(barrier);

	spv::Id output_type = build_coopmat_type(impl, output_imm);
	if (!output_type)
		return 0;

	auto *load = impl.allocate(spv::OpCooperativeMatrixLoadKHR, output_type);
	load->add_id(chain->id);
	load->add_id(builder.makeUintConstant(spv::CooperativeMatrixLayoutColumnMajorKHR));
	load->add_id(builder.makeUintConstant(16));
	impl.add(load);

	return load->id;
}